

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void OPNPrescaler_w(FM_OPN *OPN,int addr,int pre_divider)

{
  uint uVar1;
  int sel;
  int pre_divider_local;
  int addr_local;
  FM_OPN *OPN_local;
  
  switch(addr) {
  case 0:
    (OPN->ST).prescaler_sel = '\x02';
    break;
  case 1:
    break;
  case 0x2d:
    (OPN->ST).prescaler_sel = (OPN->ST).prescaler_sel | 2;
    break;
  case 0x2e:
    (OPN->ST).prescaler_sel = (OPN->ST).prescaler_sel | 1;
    break;
  case 0x2f:
    (OPN->ST).prescaler_sel = '\0';
  }
  uVar1 = (OPN->ST).prescaler_sel & 3;
  OPNSetPres(OPN,OPNPrescaler_w::opn_pres[(int)uVar1] * pre_divider,
             OPNPrescaler_w::opn_pres[(int)uVar1] * pre_divider,
             OPNPrescaler_w::ssg_pres[(int)uVar1] * pre_divider);
  return;
}

Assistant:

static void OPNPrescaler_w(FM_OPN *OPN , int addr, int pre_divider)
{
	static const int opn_pres[4] = { 2*12 , 2*12 , 6*12 , 3*12 };
	static const int ssg_pres[4] = { 1    ,    1 ,    4 ,    2 };
	int sel;

	switch(addr)
	{
	case 0:     /* when reset */
		OPN->ST.prescaler_sel = 2;
		break;
	case 1:     /* when postload */
		break;
	case 0x2d:  /* divider sel : select 1/1 for 1/3line    */
		OPN->ST.prescaler_sel |= 0x02;
		break;
	case 0x2e:  /* divider sel , select 1/3line for output */
		OPN->ST.prescaler_sel |= 0x01;
		break;
	case 0x2f:  /* divider sel , clear both selector to 1/2,1/2 */
		OPN->ST.prescaler_sel = 0;
		break;
	}
	sel = OPN->ST.prescaler_sel & 3;
	/* update prescaler */
	OPNSetPres( OPN,	opn_pres[sel]*pre_divider,
						opn_pres[sel]*pre_divider,
						ssg_pres[sel]*pre_divider );
}